

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O3

Float __thiscall pbrt::BSSRDFTable::EvalProfile(BSSRDFTable *this,int rhoIndex,int radiusIndex)

{
  ulong uVar1;
  
  if ((-1 < rhoIndex) && ((ulong)(uint)rhoIndex < (this->rhoSamples).nStored)) {
    if (-1 < radiusIndex) {
      uVar1 = (this->radiusSamples).nStored;
      if ((uint)radiusIndex < uVar1) {
        return (this->profile).ptr[uVar1 * (uint)rhoIndex + (ulong)(uint)radiusIndex];
      }
    }
    LogFatal<char_const(&)[55]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bssrdf.h"
               ,0x5a,"Check failed: %s",
               (char (*) [55])"radiusIndex >= 0 && radiusIndex < radiusSamples.size()");
  }
  LogFatal<char_const(&)[46]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bssrdf.h"
             ,0x59,"Check failed: %s",(char (*) [46])"rhoIndex >= 0 && rhoIndex < rhoSamples.size()"
            );
}

Assistant:

PBRT_CPU_GPU
    Float EvalProfile(int rhoIndex, int radiusIndex) const {
        CHECK(rhoIndex >= 0 && rhoIndex < rhoSamples.size());
        CHECK(radiusIndex >= 0 && radiusIndex < radiusSamples.size());
        return profile[rhoIndex * radiusSamples.size() + radiusIndex];
    }